

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeSwap(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  
  if (Insn >> 0x1c == 0xf) {
    DVar1 = DecodeCPSInstruction(Inst,Insn,Address,Decoder);
    return DVar1;
  }
  DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0xc & 0xf,Address,Decoder);
  if ((((DVar1 == MCDisassembler_Success) || (DVar1 == MCDisassembler_SoftFail)) &&
      ((DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn & 0xf,Address_00,Decoder),
       DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
     ((DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0x10 & 0xf,Address_01,Decoder),
      DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) {
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_02,Decoder);
    DVar1 = (*(code *)(&DAT_0031338c + *(int *)(&DAT_0031338c + (ulong)DVar1 * 4)))();
    return DVar1;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeSwap(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S;

	unsigned Rt   = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt2  = fieldFromInstruction_4(Insn, 0,  4);
	unsigned Rn   = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (pred == 0xF)
		return DecodeCPSInstruction(Inst, Insn, Address, Decoder);

	S = MCDisassembler_Success;

	if (Rt == Rn || Rn == Rt2)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rt2, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}